

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::layout_for_variable_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *var)

{
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  StorageClass SVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  SPIRType *pSVar11;
  Bitset *pBVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  char *pcVar15;
  size_t sVar16;
  runtime_error *prVar17;
  byte bVar18;
  undefined8 uVar19;
  uint *puVar20;
  uint uVar21;
  uint32_t index;
  char *pcVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  string *psVar24;
  byte bVar25;
  __hashtable *__h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  __node_base _Var27;
  byte bVar28;
  ID *__k;
  byte bVar29;
  bool bVar30;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset combined_decoration;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_12b0;
  string *local_12a8;
  SPIRType *local_12a0;
  Bitset local_1298;
  Bitset *local_1258;
  uint32_t local_124c;
  undefined1 local_1248 [288];
  undefined1 local_1128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  char acStack_1108 [16];
  char local_10f8 [8];
  __node_base_ptr ap_Stack_10f0 [508];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  uVar19 = 0x81;
  if ((this->options).es != false) {
    uVar19 = 299;
  }
  if (((this->options).version <= (uint)uVar19) ||
     (bVar3 = subpass_input_is_framebuffer_fetch(this,(var->super_IVariant).self.id), bVar3)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_1248._0_8_ = local_1248 + 0x18;
  local_1248._8_8_ = 0;
  local_1248._16_8_ = 8;
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       *(uint *)&(var->super_IVariant).field_0xc);
  pBVar12 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(var->super_IVariant).self.id)
  ;
  local_12a0 = pSVar11;
  local_1258 = Compiler::get_decoration_bitset
                         (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id);
  local_1128._0_4_ = 0x1482;
  sVar13 = ::std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::count(&(pBVar12->higher)._M_h,(key_type *)local_1128);
  if (sVar13 != 0) {
    local_1128._0_8_ = &local_1118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"passthrough","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  bVar18 = var->storage == StorageClassPushConstant & (this->options).vulkan_semantics;
  pcVar15 = (char *)CONCAT71((int7)((ulong)uVar19 >> 8),bVar18);
  if (bVar18 == 1) {
    local_1128._0_8_ = &local_1118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"push_constant","");
LAB_00127071:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  else if (var->storage == StorageClassShaderRecordBufferKHR) {
    pcVar15 = "shaderRecordEXT";
    pcVar22 = "shaderRecordNV";
    if ((ulong)this->ray_tracing_is_khr != 0) {
      pcVar22 = "shaderRecordEXT";
    }
    local_1128._0_8_ = &local_1118;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1128,pcVar22,pcVar22 + (ulong)this->ray_tracing_is_khr + 0xe);
    goto LAB_00127071;
  }
  if ((pBVar12->lower & 0x10) != 0) {
    local_1128._0_8_ = &local_1118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"row_major","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if ((pBVar12->lower & 0x20) != 0) {
    local_1128._0_8_ = &local_1118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"column_major","");
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if (((this->options).vulkan_semantics == true) && ((pBVar12->lower & 0x80000000000) != 0)) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                    DecorationInputAttachmentIndex);
    join<char_const(&)[26],unsigned_int>
              ((string *)local_1128,(spirv_cross *)"input_attachment_index = ",
               (char (*) [26])&local_1298,(uint *)pcVar15);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  __k = &(pSVar11->super_IVariant).self;
  bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)__k->id,DecorationBlock);
  local_12a8 = __return_storage_ptr__;
  if (((pBVar12->lower & 0x40000000) != 0) &&
     (bVar4 = can_use_io_location(this,var->storage,bVar3), bVar4)) {
    this_00 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)(local_1128 + 8);
    local_1128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1128._8_8_ = ap_Stack_10f0;
    local_1118._M_allocated_capacity = 1;
    local_1118._8_8_ = 0;
    acStack_1108[0] = '\0';
    acStack_1108[1] = '\0';
    acStack_1108[2] = '\0';
    acStack_1108[3] = '\0';
    acStack_1108[4] = '\0';
    acStack_1108[5] = '\0';
    acStack_1108[6] = '\0';
    acStack_1108[7] = '\0';
    acStack_1108[8] = '\0';
    acStack_1108[9] = '\0';
    acStack_1108[10] = -0x80;
    acStack_1108[0xb] = '?';
    local_10f8[0] = '\0';
    local_10f8[1] = '\0';
    local_10f8[2] = '\0';
    local_10f8[3] = '\0';
    local_10f8[4] = '\0';
    local_10f8[5] = '\0';
    local_10f8[6] = '\0';
    local_10f8[7] = '\0';
    ap_Stack_10f0[0] = (__node_base_ptr)0x0;
    pcVar15 = (char *)0x0;
    while( true ) {
      pmVar14 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->super_Compiler).ir.meta,__k);
      if ((uint *)(pmVar14->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <=
          pcVar15) break;
      Compiler::combined_decoration_for_member
                (&local_1298,&this->super_Compiler,local_12a0,(uint32_t)pcVar15);
      local_1128._0_8_ =
           local_1128._0_8_ | CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower);
      for (_Var27._M_nxt = local_1298.higher._M_h._M_before_begin._M_nxt;
          _Var27._M_nxt != (_Hash_node_base *)0x0; _Var27._M_nxt = (_Var27._M_nxt)->_M_nxt) {
        local_12b0 = this_00;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,_Var27._M_nxt + 1,&local_12b0);
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_1298.higher._M_h);
      pcVar15 = (char *)(ulong)((uint32_t)pcVar15 + 1);
    }
    if ((local_1128._0_8_ & 0x40000000) == 0) {
      uVar6 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation)
      ;
      local_12b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_12b0._4_4_,uVar6);
      join<char_const(&)[12],unsigned_int>
                ((string *)&local_1298,(spirv_cross *)"location = ",(char (*) [12])&local_12b0,
                 (uint *)pcVar15);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1298);
      if ((size_type *)CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower) !=
          &local_1298.higher._M_h._M_bucket_count) {
        operator_delete((undefined1 *)CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower));
      }
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(this_00);
  }
  EVar7 = Compiler::get_execution_model(&this->super_Compiler);
  if ((EVar7 == ExecutionModelFragment) && (var->storage == StorageClassOutput)) {
    uVar6 = Compiler::get_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation);
    bVar4 = location_is_non_coherent_framebuffer_fetch(this,uVar6);
    if (bVar4) {
      local_1128._0_8_ = &local_1118;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"noncoherent","");
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
  }
  SVar1 = var->storage;
  puVar20 = (uint *)CONCAT71((int7)((ulong)pcVar15 >> 8),SVar1 == StorageClassOutput && bVar3);
  if (SVar1 == StorageClassOutput && bVar3) {
    uVar6 = (uint32_t)
            (local_12a0->member_types).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
    uVar9 = 0;
    local_1298.lower._0_4_ = 0;
    local_12b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((ulong)local_12b0 & 0xffffffff00000000);
    puVar20 = (uint *)0x3000000000;
    bVar4 = (~pBVar12->lower & 0x3000000000) == 0;
    if (bVar4) {
      uVar8 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationXfbBuffer
                        );
      local_12b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(local_12b0._4_4_,uVar8);
      local_1298.lower._0_4_ =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationXfbStride);
    }
    bVar30 = (pBVar12->lower & 0x20000000) != 0;
    if (bVar30) {
      uVar9 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationStream);
    }
    index = 0;
    uVar8 = index;
    if (uVar6 != 0) {
      uVar8 = 0;
      do {
        bVar5 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)__k->id,index,DecorationStream);
        if (bVar5) {
          uVar10 = Compiler::get_member_decoration
                             (&this->super_Compiler,(TypeID)__k->id,index,DecorationStream);
          if (bVar30) {
            bVar30 = true;
            bVar5 = uVar10 != uVar9;
            uVar9 = uVar10;
            if (bVar5) {
              prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar17,"IO block member Stream mismatch.");
              *(undefined ***)prVar17 = &PTR__runtime_error_0035fca8;
              __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          else {
            bVar30 = true;
            uVar9 = uVar10;
          }
        }
        puVar20 = (uint *)0x23;
        bVar5 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)__k->id,index,DecorationOffset);
        if (bVar5) {
          bVar5 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbBuffer);
          if (bVar5) {
            uVar8 = Compiler::get_member_decoration
                              (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbBuffer);
            if ((bVar4) && (uVar8 != (uint32_t)local_12b0)) {
              prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar17,"IO block member XfbBuffer mismatch.");
              *(undefined ***)prVar17 = &PTR__runtime_error_0035fca8;
              __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            local_12b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)CONCAT44(local_12b0._4_4_,uVar8);
            bVar4 = true;
          }
          puVar20 = (uint *)0x25;
          bVar5 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbStride);
          uVar8 = 1;
          if (bVar5) {
            puVar20 = (uint *)0x25;
            uVar10 = Compiler::get_member_decoration
                               (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbStride);
            if ((bVar4 != false) && (uVar10 != (uint32_t)local_1298.lower)) {
              prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error(prVar17,"IO block member XfbStride mismatch.");
              *(undefined ***)prVar17 = &PTR__runtime_error_0035fca8;
              __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            uVar8 = 1;
            bVar4 = true;
            local_1298.lower._0_4_ = uVar10;
          }
        }
        index = index + 1;
      } while (uVar6 != index);
    }
    if (((byte)uVar8 & bVar4) == 0) {
      bVar4 = false;
    }
    else {
      join<char_const(&)[14],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_12b0,
                 puVar20);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      join<char_const(&)[14],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)0x2b683e,(char (*) [14])&local_1298,puVar20);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      bVar4 = true;
    }
    if (bVar30) {
      EVar7 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar7 != ExecutionModelGeometry) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Geometry streams can only be used in geometry shaders.");
LAB_0012809d:
        *(undefined ***)prVar17 = &PTR__runtime_error_0035fca8;
        __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).es == true) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Multiple geometry streams not supported in ESSL.");
        goto LAB_0012809d;
      }
      if ((this->options).version < 400) {
        local_1128._0_8_ = &local_1118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_transform_feedback3","");
        require_extension_internal(this,(string *)local_1128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      local_124c = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationStream);
      join<char_const(&)[10],unsigned_int>
                ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_124c,puVar20)
      ;
LAB_001278bc:
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
  }
  else if (SVar1 == StorageClassOutput) {
    puVar20 = (uint *)0x3800000000;
    if ((~pBVar12->lower & 0x3800000000) == 0) {
      local_1298.lower._0_4_ =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationXfbBuffer);
      join<char_const(&)[14],unsigned_int>
                ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_1298,
                 puVar20);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      local_1298.lower._0_4_ =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationXfbStride);
      join<char_const(&)[14],unsigned_int>
                ((string *)local_1128,(spirv_cross *)0x2b683e,(char (*) [14])&local_1298,puVar20);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      local_1298.lower._0_4_ =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationOffset);
      join<char_const(&)[14],unsigned_int>
                ((string *)local_1128,(spirv_cross *)0x2b68a2,(char (*) [14])&local_1298,puVar20);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1248,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((pBVar12->lower & 0x20000000) != 0) {
      EVar7 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar7 != ExecutionModelGeometry) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Geometry streams can only be used in geometry shaders.");
        goto LAB_001280f7;
      }
      if ((this->options).es == true) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Multiple geometry streams not supported in ESSL.");
        goto LAB_001280f7;
      }
      if ((this->options).version < 400) {
        local_1128._0_8_ = &local_1118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_transform_feedback3","");
        require_extension_internal(this,(string *)local_1128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      local_1298.lower._0_4_ =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationStream);
      join<char_const(&)[10],unsigned_int>
                ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_1298,puVar20)
      ;
      goto LAB_001278bc;
    }
  }
  else {
    bVar4 = false;
  }
  if (((pBVar12->lower & 0x80000000) != 0) &&
     (bVar3 = can_use_io_location(this,var->storage,bVar3), bVar3)) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationComponent);
    join<char_const(&)[13],unsigned_int>
              ((string *)local_1128,(spirv_cross *)"component = ",(char (*) [13])&local_1298,puVar20
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
    bVar4 = true;
  }
  if (bVar4) {
    if ((this->options).es != false) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"GL_ARB_enhanced_layouts is not supported in ESSL.");
LAB_001280f7:
      *(undefined ***)prVar17 = &PTR__runtime_error_0035fca8;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar2 = (this->options).version;
    uVar21 = uVar2 - 0x8c;
    puVar20 = (uint *)(ulong)uVar21;
    if (uVar21 < 300) {
      local_1128._0_8_ = &local_1118;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_enhanced_layouts","");
      require_extension_internal(this,(string *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
    else if (uVar2 < 0x8c) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.");
      goto LAB_001280f7;
    }
    if (((this->options).es == false) && ((this->options).version < 0x1b8)) {
      local_1128._0_8_ = &local_1118;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1128,"GL_ARB_enhanced_layouts","");
      require_extension_internal(this,(string *)local_1128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
      }
    }
  }
  if ((pBVar12->lower & 0x100000000) != 0) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationIndex);
    join<char_const(&)[9],unsigned_int>
              ((string *)local_1128,(spirv_cross *)0x2b5350,(char (*) [9])&local_1298,puVar20);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if ((((var->storage != StorageClassPushConstant) &&
       (var->storage != StorageClassShaderRecordBufferKHR)) && ((pBVar12->lower & 0x400000000) != 0)
      ) && ((this->options).vulkan_semantics == true)) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationDescriptorSet)
    ;
    join<char_const(&)[7],unsigned_int>
              ((string *)local_1128,(spirv_cross *)0x2b68a9,(char (*) [7])&local_1298,puVar20);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  SVar1 = var->storage;
  bVar18 = 1;
  if ((SVar1 != StorageClassShaderRecordBufferKHR) && (SVar1 != StorageClassStorageBuffer)) {
    if (SVar1 == StorageClassUniform) {
      bVar18 = ((byte)local_1258->lower & 8) >> 3;
    }
    else {
      bVar18 = 0;
    }
  }
  bVar25 = (byte)(((uint)local_1258->lower & 4) >> 2) & SVar1 == StorageClassUniform;
  bVar3 = (this->options).es;
  uVar21 = 0x8b;
  if (bVar3 != false) {
    uVar21 = 299;
  }
  uVar2 = (this->options).version;
  if (bVar3 == true) {
    bVar29 = 0x135 < uVar2;
  }
  else {
    bVar29 = 0x1a3 < uVar2 | (this->options).enable_420pack_extension;
  }
  puVar20 = (uint *)(ulong)CONCAT31((int3)(uVar2 >> 8),bVar29);
  bVar3 = (this->options).emit_push_constant_as_uniform_buffer;
  bVar4 = (this->options).vulkan_semantics;
  bVar28 = (this->options).emit_uniform_buffer_as_plain_uniforms & bVar25 | uVar2 <= uVar21;
  if (((SVar1 != StorageClassShaderRecordBufferKHR) &&
      ((SVar1 == StorageClassUniform & bVar28) == 0)) &&
     ((bVar29 != 0 && ((pBVar12->lower & 0x200000000) != 0)))) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationBinding);
    join<char_const(&)[11],unsigned_int>
              ((string *)local_1128,(spirv_cross *)"binding = ",(char (*) [11])&local_1298,puVar20);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  if ((var->storage != StorageClassOutput) && ((pBVar12->lower & 0x800000000) != 0)) {
    local_1298.lower._0_4_ =
         Compiler::get_decoration
                   (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationOffset);
    join<char_const(&)[10],unsigned_int>
              ((string *)local_1128,(spirv_cross *)0x2b68a6,(char (*) [10])&local_1298,puVar20);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  pSVar11 = local_12a0;
  if (bVar28 == 0) {
    if (bVar25 == 0 && (SVar1 == StorageClassPushConstant & bVar3) == 0) {
      if ((byte)(SVar1 == StorageClassPushConstant & bVar4 | bVar18) != 1) goto LAB_00127d83;
      buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,local_12a0,true,true);
    }
    else {
      buffer_to_packing_standard_abi_cxx11_((string *)local_1128,this,local_12a0,false,true);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
LAB_00127d83:
  psVar24 = local_12a8;
  if (((pSVar11->basetype == Image) && ((pSVar11->image).sampled == 2)) &&
     (pcVar15 = format_to_glsl(this,(pSVar11->image).format), pcVar15 != (char *)0x0)) {
    local_1128._0_8_ = &local_1118;
    sVar16 = strlen(pcVar15);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,pcVar15,pcVar15 + sVar16)
    ;
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1248,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  (psVar24->_M_dataplus)._M_p = (pointer)&psVar24->field_2;
  if (local_1248._8_8_ == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar24,"");
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar24,"layout(","");
    local_110 = local_f8;
    local_1128._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1128._8_8_ = (__node_base_ptr *)0x0;
    local_1118._M_allocated_capacity = 0;
    sStack_108 = 0;
    local_100 = 8;
    StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
    if (local_1248._8_8_ != 0) {
      pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_1248._0_8_ + local_1248._8_8_ * 0x20);
      pbVar26 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1248._0_8_;
      do {
        StringStream<4096UL,_4096UL>::append
                  ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar26->_M_dataplus)._M_p,
                   pbVar26->_M_string_length);
        if (pbVar26 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (local_1248._0_8_ + (local_1248._8_8_ - 1) * 0x20)) {
          StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
        }
        pbVar26 = pbVar26 + 1;
      } while (pbVar26 != pbVar23);
    }
    StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_1298,local_1128);
    StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
    psVar24 = local_12a8;
    ::std::__cxx11::string::_M_append
              ((char *)local_12a8,CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower));
    if ((size_type *)CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower) !=
        &local_1298.higher._M_h._M_bucket_count) {
      operator_delete((undefined1 *)CONCAT44(local_1298.lower._4_4_,(uint32_t)local_1298.lower));
    }
    ::std::__cxx11::string::append((char *)psVar24);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1248);
  return psVar24;
}

Assistant:

string CompilerGLSL::layout_for_variable(const SPIRVariable &var)
{
	// FIXME: Come up with a better solution for when to disable layouts.
	// Having layouts depend on extensions as well as which types
	// of layouts are used. For now, the simple solution is to just disable
	// layouts for legacy versions.
	if (is_legacy())
		return "";

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	SmallVector<string> attr;

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = get_decoration_bitset(var.self);
	auto &typeflags = get_decoration_bitset(type.self);

	if (flags.get(DecorationPassthroughNV))
		attr.push_back("passthrough");

	if (options.vulkan_semantics && var.storage == StorageClassPushConstant)
		attr.push_back("push_constant");
	else if (var.storage == StorageClassShaderRecordBufferKHR)
		attr.push_back(ray_tracing_is_khr ? "shaderRecordEXT" : "shaderRecordNV");

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	if (flags.get(DecorationColMajor))
		attr.push_back("column_major");

	if (options.vulkan_semantics)
	{
		if (flags.get(DecorationInputAttachmentIndex))
			attr.push_back(join("input_attachment_index = ", get_decoration(var.self, DecorationInputAttachmentIndex)));
	}

	bool is_block = has_decoration(type.self, DecorationBlock);
	if (flags.get(DecorationLocation) && can_use_io_location(var.storage, is_block))
	{
		Bitset combined_decoration;
		for (uint32_t i = 0; i < ir.meta[type.self].members.size(); i++)
			combined_decoration.merge_or(combined_decoration_for_member(type, i));

		// If our members have location decorations, we don't need to
		// emit location decorations at the top as well (looks weird).
		if (!combined_decoration.get(DecorationLocation))
			attr.push_back(join("location = ", get_decoration(var.self, DecorationLocation)));
	}

	if (get_execution_model() == ExecutionModelFragment && var.storage == StorageClassOutput &&
	    location_is_non_coherent_framebuffer_fetch(get_decoration(var.self, DecorationLocation)))
	{
		attr.push_back("noncoherent");
	}

	// Transform feedback
	bool uses_enhanced_layouts = false;
	if (is_block && var.storage == StorageClassOutput)
	{
		// For blocks, there is a restriction where xfb_stride/xfb_buffer must only be declared on the block itself,
		// since all members must match the same xfb_buffer. The only thing we will declare for members of the block
		// is the xfb_offset.
		uint32_t member_count = uint32_t(type.member_types.size());
		bool have_xfb_buffer_stride = false;
		bool have_any_xfb_offset = false;
		bool have_geom_stream = false;
		uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;

		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride))
		{
			have_xfb_buffer_stride = true;
			xfb_buffer = get_decoration(var.self, DecorationXfbBuffer);
			xfb_stride = get_decoration(var.self, DecorationXfbStride);
		}

		if (flags.get(DecorationStream))
		{
			have_geom_stream = true;
			geom_stream = get_decoration(var.self, DecorationStream);
		}

		// Verify that none of the members violate our assumption.
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationStream))
			{
				uint32_t member_geom_stream = get_member_decoration(type.self, i, DecorationStream);
				if (have_geom_stream && member_geom_stream != geom_stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = member_geom_stream;
			}

			// Only members with an Offset decoration participate in XFB.
			if (!has_member_decoration(type.self, i, DecorationOffset))
				continue;
			have_any_xfb_offset = true;

			if (has_member_decoration(type.self, i, DecorationXfbBuffer))
			{
				uint32_t buffer_index = get_member_decoration(type.self, i, DecorationXfbBuffer);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
			}

			if (has_member_decoration(type.self, i, DecorationXfbStride))
			{
				uint32_t stride = get_member_decoration(type.self, i, DecorationXfbStride);
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbStride mismatch.");
				have_xfb_buffer_stride = true;
				xfb_stride = stride;
			}
		}

		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			attr.push_back(join("xfb_buffer = ", xfb_buffer));
			attr.push_back(join("xfb_stride = ", xfb_stride));
			uses_enhanced_layouts = true;
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}
	else if (var.storage == StorageClassOutput)
	{
		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride) && flags.get(DecorationOffset))
		{
			// XFB for standalone variables, we can emit all decorations.
			attr.push_back(join("xfb_buffer = ", get_decoration(var.self, DecorationXfbBuffer)));
			attr.push_back(join("xfb_stride = ", get_decoration(var.self, DecorationXfbStride)));
			attr.push_back(join("xfb_offset = ", get_decoration(var.self, DecorationOffset)));
			uses_enhanced_layouts = true;
		}

		if (flags.get(DecorationStream))
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}

	// Can only declare Component if we can declare location.
	if (flags.get(DecorationComponent) && can_use_io_location(var.storage, is_block))
	{
		uses_enhanced_layouts = true;
		attr.push_back(join("component = ", get_decoration(var.self, DecorationComponent)));
	}

	if (uses_enhanced_layouts)
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.");
			if (!options.es && options.version < 440)
				require_extension_internal("GL_ARB_enhanced_layouts");
		}
		else if (options.es)
			SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in ESSL.");
	}

	if (flags.get(DecorationIndex))
		attr.push_back(join("index = ", get_decoration(var.self, DecorationIndex)));

	// Do not emit set = decoration in regular GLSL output, but
	// we need to preserve it in Vulkan GLSL mode.
	if (var.storage != StorageClassPushConstant && var.storage != StorageClassShaderRecordBufferKHR)
	{
		if (flags.get(DecorationDescriptorSet) && options.vulkan_semantics)
			attr.push_back(join("set = ", get_decoration(var.self, DecorationDescriptorSet)));
	}

	bool push_constant_block = options.vulkan_semantics && var.storage == StorageClassPushConstant;
	bool ssbo_block = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	                  (var.storage == StorageClassUniform && typeflags.get(DecorationBufferBlock));
	bool emulated_ubo = var.storage == StorageClassPushConstant && options.emit_push_constant_as_uniform_buffer;
	bool ubo_block = var.storage == StorageClassUniform && typeflags.get(DecorationBlock);

	// GL 3.0/GLSL 1.30 is not considered legacy, but it doesn't have UBOs ...
	bool can_use_buffer_blocks = (options.es && options.version >= 300) || (!options.es && options.version >= 140);

	// pretend no UBOs when options say so
	if (ubo_block && options.emit_uniform_buffer_as_plain_uniforms)
		can_use_buffer_blocks = false;

	bool can_use_binding;
	if (options.es)
		can_use_binding = options.version >= 310;
	else
		can_use_binding = options.enable_420pack_extension || (options.version >= 420);

	// Make sure we don't emit binding layout for a classic uniform on GLSL 1.30.
	if (!can_use_buffer_blocks && var.storage == StorageClassUniform)
		can_use_binding = false;

	if (var.storage == StorageClassShaderRecordBufferKHR)
		can_use_binding = false;

	if (can_use_binding && flags.get(DecorationBinding))
		attr.push_back(join("binding = ", get_decoration(var.self, DecorationBinding)));

	if (var.storage != StorageClassOutput && flags.get(DecorationOffset))
		attr.push_back(join("offset = ", get_decoration(var.self, DecorationOffset)));

	// Instead of adding explicit offsets for every element here, just assume we're using std140 or std430.
	// If SPIR-V does not comply with either layout, we cannot really work around it.
	if (can_use_buffer_blocks && (ubo_block || emulated_ubo))
	{
		attr.push_back(buffer_to_packing_standard(type, false, true));
	}
	else if (can_use_buffer_blocks && (push_constant_block || ssbo_block))
	{
		attr.push_back(buffer_to_packing_standard(type, true, true));
	}

	// For images, the type itself adds a layout qualifer.
	// Only emit the format for storage images.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2)
	{
		const char *fmt = format_to_glsl(type.image.format);
		if (fmt)
			attr.push_back(fmt);
	}

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}